

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::ForkBranchBase::releaseHub(ForkBranchBase *this,ExceptionOrValue *output)

{
  NullableValue<kj::Exception> _exception2536;
  NullableValue<kj::Exception> local_4c8;
  NullableValue<kj::Exception> local_330;
  
  Own<kj::_::ForkHubBase,_kj::_::ForkHubBase>::dispose(&this->hub);
  local_4c8.isSet = false;
  NullableValue<kj::Exception>::NullableValue(&local_330,&local_4c8);
  NullableValue<kj::Exception>::~NullableValue(&local_4c8);
  if (local_330.isSet == true) {
    ExceptionOrValue::addException(output,&local_330.field_1.value);
  }
  NullableValue<kj::Exception>::~NullableValue(&local_330);
  return;
}

Assistant:

void ForkBranchBase::releaseHub(ExceptionOrValue& output) {
  KJ_IF_SOME(exception, kj::runCatchingExceptions([this]() {
    hub = nullptr;
  })) {
    output.addException(kj::mv(exception));
  }
}